

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_client.cpp
# Opt level: O0

int __thiscall CNetClient::Recv(CNetClient *this,CNetChunk *pChunk,TOKEN *pResponseToken)

{
  int iVar1;
  int iVar2;
  CNetPacketConstruct *in_RDX;
  CNetPacketConstruct *in_RSI;
  CNetConnection *in_RDI;
  long in_FS_OFFSET;
  NETADDR *unaff_retaddr;
  CNetTokenCache *in_stack_00000008;
  int Accept;
  int Result;
  NETADDR_conflict Addr;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb8;
  CNetConnection *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  CNetPacketConstruct *in_stack_ffffffffffffffe0;
  NETADDR *in_stack_ffffffffffffffe8;
  CNetTokenManager *in_stack_fffffffffffffff0;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
LAB_00155bdf:
  do {
    iVar1 = CNetRecvUnpacker::FetchChunk
                      ((CNetRecvUnpacker *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (CNetChunk *)this_00);
    if (iVar1 != 0) {
      iVar1 = 1;
      goto LAB_00155e4d;
    }
    iVar1 = CNetBase::UnpackPacket
                      ((CNetBase *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (NETADDR *)this_00,(uchar *)in_RSI,in_RDX);
    if (0 < iVar1) {
      iVar1 = 0;
      goto LAB_00155e4d;
    }
  } while (iVar1 != 0);
  iVar2 = CNetConnection::State((CNetConnection *)((in_RDI->m_Buffer).m_aBuffer + 0x4210));
  if ((iVar2 != 0) &&
     (iVar2 = CNetConnection::State((CNetConnection *)((in_RDI->m_Buffer).m_aBuffer + 0x4210)),
     iVar2 != 5)) {
    CNetConnection::PeerAddress((CNetConnection *)((in_RDI->m_Buffer).m_aBuffer + 0x4210));
    iVar1 = net_addr_comp((NETADDR *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),(NETADDR *)in_RDI,
                          in_stack_ffffffffffffffac);
    if (iVar1 == 0) {
      iVar1 = CNetConnection::Feed(this_00,in_RSI,(NETADDR_conflict *)in_RDX);
      if ((iVar1 != 0) && ((*(uint *)(in_RDI[1].m_Buffer.m_aBuffer + 0x4248) & 8) == 0)) {
        CNetRecvUnpacker::Start
                  ((CNetRecvUnpacker *)(in_RDI[1].m_Buffer.m_aBuffer + 0x4210),
                   (NETADDR *)&stack0xffffffffffffffe0,
                   (CNetConnection *)((in_RDI->m_Buffer).m_aBuffer + 0x4210),0);
      }
      goto LAB_00155bdf;
    }
  }
  in_stack_ffffffffffffffb8 =
       CNetTokenManager::ProcessMessage
                 (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (in_stack_ffffffffffffffb8 != 0) {
    if ((*(uint *)(in_RDI[1].m_Buffer.m_aBuffer + 0x4248) & 1) == 0) {
      if (((*(uint *)(in_RDI[1].m_Buffer.m_aBuffer + 0x4248) & 8) != 0) &&
         (in_stack_ffffffffffffffb8 != -1)) {
        in_RSI->m_aChunkData[4] = '\x02';
        in_RSI->m_aChunkData[5] = '\0';
        in_RSI->m_aChunkData[6] = '\0';
        in_RSI->m_aChunkData[7] = '\0';
        in_RSI->m_Token = 0xffffffff;
        *(CNetPacketConstruct **)&in_RSI->m_ResponseToken = in_stack_ffffffffffffffe0;
        *(NETADDR **)&in_RSI->m_Ack = in_stack_ffffffffffffffe8;
        *(CNetTokenManager **)&in_RSI->m_DataSize = in_stack_fffffffffffffff0;
        *(undefined4 *)(in_RSI->m_aChunkData + 8) =
             *(undefined4 *)(in_RDI[1].m_Buffer.m_aBuffer + 0x4254);
        *(uchar **)(in_RSI->m_aChunkData + 0x10) = in_RDI[1].m_Buffer.m_aBuffer + 0x4258;
        if (in_RDX != (CNetPacketConstruct *)0x0) {
          in_RDX->m_Token = *(TOKEN *)(in_RDI[1].m_Buffer.m_aBuffer + 0x4244);
        }
        iVar1 = 1;
LAB_00155e4d:
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
          __stack_chk_fail();
        }
        return iVar1;
      }
    }
    else if (in_RDI[1].m_Buffer.m_aBuffer[0x4258] == '\x05') {
      CNetTokenCache::AddToken
                (in_stack_00000008,unaff_retaddr,(TOKEN)((ulong)lVar3 >> 0x20),(int)lVar3);
    }
  }
  goto LAB_00155bdf;
}

Assistant:

int CNetClient::Recv(CNetChunk *pChunk, TOKEN *pResponseToken)
{
	while(1)
	{
		// check for a chunk
		if(m_RecvUnpacker.FetchChunk(pChunk))
			return 1;

		// TODO: empty the recvinfo
		NETADDR Addr;
		int Result = UnpackPacket(&Addr, m_RecvUnpacker.m_aBuffer, &m_RecvUnpacker.m_Data);
		// no more packets for now
		if(Result > 0)
			break;

		if(!Result)
		{
			if(m_Connection.State() != NET_CONNSTATE_OFFLINE && m_Connection.State() != NET_CONNSTATE_ERROR && net_addr_comp(m_Connection.PeerAddress(), &Addr, true) == 0)
			{
				if(m_Connection.Feed(&m_RecvUnpacker.m_Data, &Addr))
				{
					if(!(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONNLESS))
						m_RecvUnpacker.Start(&Addr, &m_Connection, 0);
				}
			}
			else
			{
				int Accept = m_TokenManager.ProcessMessage(&Addr, &m_RecvUnpacker.m_Data);
				if(!Accept)
					continue;

				if(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONTROL)
				{
					if(m_RecvUnpacker.m_Data.m_aChunkData[0] == NET_CTRLMSG_TOKEN)
						m_TokenCache.AddToken(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, NET_TOKENFLAG_ALLOWBROADCAST|NET_TOKENFLAG_RESPONSEONLY);
				}
				else if(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONNLESS && Accept != -1)
				{
					pChunk->m_Flags = NETSENDFLAG_CONNLESS;
					pChunk->m_ClientID = -1;
					pChunk->m_Address = Addr;
					pChunk->m_DataSize = m_RecvUnpacker.m_Data.m_DataSize;
					pChunk->m_pData = m_RecvUnpacker.m_Data.m_aChunkData;

					if(pResponseToken)
						*pResponseToken = m_RecvUnpacker.m_Data.m_ResponseToken;
					return 1;
				}
			}
		}
	}
	return 0;
}